

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericTypes.hpp
# Opt level: O0

string * sdglib::str_rc(string *sequence)

{
  ulong uVar1;
  undefined1 *puVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t j;
  size_t i;
  string *rseq;
  ulong local_30;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)in_RDI);
  local_30 = 0;
  std::__cxx11::string::size();
  for (; uVar1 = std::__cxx11::string::size(), local_30 < uVar1; local_30 = local_30 + 1) {
    puVar2 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
    switch(*puVar2) {
    case 0x41:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x54;
      break;
    case 0x43:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x47;
      break;
    case 0x47:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x43;
      break;
    case 0x54:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x41;
      break;
    case 0x61:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x74;
      break;
    case 99:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x67;
      break;
    case 0x67:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 99;
      break;
    case 0x74:
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar2 = 0x61;
    }
  }
  return in_RDI;
}

Assistant:

inline std::string str_rc(const std::string &sequence) {
        std::string rseq;
        rseq.resize(sequence.size());
        for (size_t i = 0, j = sequence.size() - 1; i < sequence.size(); ++i, --j) {
            switch (sequence[j]) {
                case 'A':
                    rseq[i] = 'T';
                    break;
                case 'C':
                    rseq[i] = 'G';
                    break;
                case 'G':
                    rseq[i] = 'C';
                    break;
                case 'T':
                    rseq[i] = 'A';
                    break;
                case 'a':
                    rseq[i] = 't';
                    break;
                case 'c':
                    rseq[i] = 'g';
                    break;
                case 'g':
                    rseq[i] = 'c';
                    break;
                case 't':
                    rseq[i] = 'a';
                    break;
            }
        }
        return rseq;
    }